

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Instruction::IsOpaqueType(Instruction *this)

{
  Op OVar1;
  uint32_t id;
  IRContext *this_00;
  DefUseManager *this_01;
  Instruction *this_02;
  bool local_69;
  Instruction *sub_type_inst;
  undefined1 auStack_50 [4];
  uint32_t sub_type_id;
  Instruction *local_48;
  function<void_(const_unsigned_int_*)> local_40;
  bool local_19;
  Instruction *pIStack_18;
  bool is_opaque;
  Instruction *this_local;
  
  pIStack_18 = this;
  OVar1 = opcode(this);
  if (OVar1 == OpTypeStruct) {
    local_19 = false;
    _auStack_50 = &local_19;
    local_48 = this;
    std::function<void(unsigned_int_const*)>::
    function<spvtools::opt::Instruction::IsOpaqueType()const::__0,void>
              ((function<void(unsigned_int_const*)> *)&local_40,
               (anon_class_16_2_429c77bf *)auStack_50);
    ForEachInOperand(this,&local_40);
    std::function<void_(const_unsigned_int_*)>::~function(&local_40);
    this_local._7_1_ = (bool)(local_19 & 1);
  }
  else {
    OVar1 = opcode(this);
    if (OVar1 == OpTypeArray) {
      id = GetSingleWordInOperand(this,0);
      this_00 = context(this);
      this_01 = IRContext::get_def_use_mgr(this_00);
      this_02 = analysis::DefUseManager::GetDef(this_01,id);
      this_local._7_1_ = IsOpaqueType(this_02);
    }
    else {
      OVar1 = opcode(this);
      local_69 = true;
      if (OVar1 != OpTypeRuntimeArray) {
        OVar1 = opcode(this);
        local_69 = spvOpcodeIsBaseOpaqueType(OVar1);
      }
      this_local._7_1_ = local_69;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Instruction::IsOpaqueType() const {
  if (opcode() == spv::Op::OpTypeStruct) {
    bool is_opaque = false;
    ForEachInOperand([&is_opaque, this](const uint32_t* op_id) {
      Instruction* type_inst = context()->get_def_use_mgr()->GetDef(*op_id);
      is_opaque |= type_inst->IsOpaqueType();
    });
    return is_opaque;
  } else if (opcode() == spv::Op::OpTypeArray) {
    uint32_t sub_type_id = GetSingleWordInOperand(0);
    Instruction* sub_type_inst =
        context()->get_def_use_mgr()->GetDef(sub_type_id);
    return sub_type_inst->IsOpaqueType();
  } else {
    return opcode() == spv::Op::OpTypeRuntimeArray ||
           spvOpcodeIsBaseOpaqueType(opcode());
  }
}